

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O2

void Gme_File::copy_field_(char *out,char *in,int in_size)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  char *pcVar3;
  char *__src;
  
  if ((in != (char *)0x0) && (*in != '\0')) {
    pcVar3 = in + (uint)in_size;
    for (; (__src = pcVar3, in_size != 0 && (__src = in, (int)*in - 1U < 0x20)); in = in + 1) {
      in_size = in_size + -1;
    }
    iVar1 = 0xff;
    if (in_size < 0xff) {
      iVar1 = in_size;
    }
    for (sVar2 = 0; ((long)sVar2 < (long)iVar1 && (__src[sVar2] != '\0')); sVar2 = sVar2 + 1) {
    }
    do {
      __n = sVar2;
      if (__n == 0) break;
      sVar2 = __n - 1;
    } while ((byte)__src[__n - 1] < 0x21);
    out[__n] = '\0';
    memcpy(out,__src,__n);
    if ((((*out == '?') && (out[1] == '\0')) || (iVar1 = strcmp(out,"<?>"), iVar1 == 0)) ||
       (iVar1 = strcmp(out,"< ? >"), iVar1 == 0)) {
      *out = '\0';
    }
  }
  return;
}

Assistant:

void Gme_File::copy_field_( char* out, const char* in, int in_size )
{
	if ( !in || !*in )
		return;
	
	// remove spaces/junk from beginning
	while ( in_size && unsigned (*in - 1) <= ' ' - 1 )
	{
		in++;
		in_size--;
	}
	
	// truncate
	if ( in_size > max_field_ )
		in_size = max_field_;
	
	// find terminator
	int len = 0;
	while ( len < in_size && in [len] )
		len++;
	
	// remove spaces/junk from end
	while ( len && unsigned (in [len - 1]) <= ' ' )
		len--;
	
	// copy
	out [len] = 0;
	memcpy( out, in, len );
	
	// strip out stupid fields that should have been left blank
	if ( !strcmp( out, "?" ) || !strcmp( out, "<?>" ) || !strcmp( out, "< ? >" ) )
		out [0] = 0;
}